

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest_rewriter.cpp
# Opt level: O2

void __thiscall
duckdb::UnnestRewriterPlanUpdater::VisitExpression
          (UnnestRewriterPlanUpdater *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  idx_t iVar1;
  pointer pEVar2;
  BoundColumnRefExpression *pBVar3;
  reference pvVar4;
  type pEVar5;
  undefined8 extraout_RDX;
  idx_t i;
  ulong __n;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  if ((pEVar2->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expression);
    pBVar3 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar2->super_BaseExpression);
    for (__n = 0; __n < (ulong)((long)(this->replace_bindings).
                                      super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>
                                      .
                                      super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->replace_bindings).
                                      super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>
                                      .
                                      super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1
        ) {
      pvVar4 = vector<duckdb::ReplaceBinding,_true>::get<true>(&this->replace_bindings,__n);
      if (((pBVar3->binding).table_index == (pvVar4->old_binding).table_index) &&
         ((pBVar3->binding).column_index == (pvVar4->old_binding).column_index)) {
        pvVar4 = vector<duckdb::ReplaceBinding,_true>::get<true>(&this->replace_bindings,__n);
        iVar1 = (pvVar4->new_binding).column_index;
        (pBVar3->binding).table_index = (pvVar4->new_binding).table_index;
        (pBVar3->binding).column_index = iVar1;
        break;
      }
    }
  }
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (expression);
  UNRECOVERED_JUMPTABLE = (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[4];
  (*UNRECOVERED_JUMPTABLE)(this,pEVar5,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void UnnestRewriterPlanUpdater::VisitExpression(unique_ptr<Expression> *expression) {
	auto &expr = *expression;

	if (expr->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF) {
		auto &bound_column_ref = expr->Cast<BoundColumnRefExpression>();
		for (idx_t i = 0; i < replace_bindings.size(); i++) {
			if (bound_column_ref.binding == replace_bindings[i].old_binding) {
				bound_column_ref.binding = replace_bindings[i].new_binding;
				break;
			}
		}
	}

	VisitExpressionChildren(**expression);
}